

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# f2c_lite.c
# Opt level: O2

integer pow_ii(integer *ap,integer *bp)

{
  int iVar1;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  int iVar2;
  
  iVar3 = *ap;
  uVar4 = *bp;
  if ((int)uVar4 < 1) {
    if (iVar3 == 1 || uVar4 == 0) {
      return 1;
    }
    if (iVar3 != -1) {
      return 0;
    }
    uVar4 = -uVar4;
  }
  uVar5 = (ulong)uVar4;
  iVar1 = 1;
  while( true ) {
    iVar2 = iVar3;
    if ((uVar5 & 1) == 0) {
      iVar2 = 1;
    }
    iVar1 = iVar2 * iVar1;
    if (uVar5 < 2) break;
    uVar5 = uVar5 >> 1;
    iVar3 = iVar3 * iVar3;
  }
  return iVar1;
}

Assistant:

integer pow_ii(ap, bp) integer *ap, *bp;
#else
    integer pow_ii(integer * ap, integer * bp)
#endif
    {
        integer pow, x, n;
        unsigned long u;

         x = *ap;
         n = *bp;

        if (n <= 0) {
            if (n == 0 || x == 1)
                return 1;
            if (x != -1)
                return x != 0 ? 1 / x : 0;
            n = -n;
        }